

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O3

int __thiscall cppcms::http::request::on_content_progress(request *this,size_t n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_content_filter *pbVar3;
  multipart_parser *pmVar4;
  long *plVar5;
  bool bVar6;
  parsing_result_type pVar7;
  int iVar8;
  longlong size;
  file *pfVar9;
  long lVar10;
  request *this_00;
  istream *piVar11;
  _data *p_Var12;
  long lVar13;
  char *buffer_end;
  pointer psVar14;
  char *begin;
  file_ptr f;
  files_type result;
  pointer local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  value_type local_c8;
  string local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
  local_58;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_38;
  
  if (n != 0) {
    p_Var12 = (this->d).ptr_;
    pcVar2 = (p_Var12->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var12->read_size = p_Var12->read_size + n;
    local_f0 = pcVar2;
    if (p_Var12->filter_is_raw_content_filter == true) {
      (*p_Var12->filter->_vptr_basic_content_filter[4])(p_Var12->filter,pcVar2,n);
      p_Var12 = (this->d).ptr_;
    }
    if ((p_Var12->multipart_parser).ptr_ == (multipart_parser *)0x0) {
      lVar10 = p_Var12->content_length;
      lVar13 = p_Var12->read_size;
    }
    else {
      size = content_limits::content_length_limit(&p_Var12->limits);
      buffer_end = pcVar2 + n;
      if (local_f0 == buffer_end) {
        bVar6 = false;
      }
      else {
        do {
          pVar7 = cppcms::impl::multipart_parser::consume
                            ((((this->d).ptr_)->multipart_parser).ptr_,&local_f0,buffer_end);
          switch(pVar7) {
          case meta_ready:
            p_Var12 = (this->d).ptr_;
            if (p_Var12->filter_is_multipart_filter == true) {
              pfVar9 = cppcms::impl::multipart_parser::get_file((p_Var12->multipart_parser).ptr_);
              pbVar3 = ((this->d).ptr_)->filter;
              (*pbVar3->_vptr_basic_content_filter[4])(pbVar3,pfVar9);
            }
            break;
          case content_partial:
            pfVar9 = cppcms::impl::multipart_parser::get_file
                               ((((this->d).ptr_)->multipart_parser).ptr_);
            bVar6 = size_ok(this,pfVar9,size);
            if (!bVar6) {
              return 0x19d;
            }
            p_Var12 = (this->d).ptr_;
            if (p_Var12->filter_is_multipart_filter == true) {
              pbVar3 = p_Var12->filter;
              (*pbVar3->_vptr_basic_content_filter[5])(pbVar3,pfVar9);
            }
            break;
          case content_ready:
            pfVar9 = cppcms::impl::multipart_parser::last_file
                               ((((this->d).ptr_)->multipart_parser).ptr_);
            piVar11 = file::data(pfVar9);
            std::istream::seekg(piVar11,0,0);
            bVar6 = size_ok(this,pfVar9,size);
            if (!bVar6) {
              return 0x19d;
            }
            p_Var12 = (this->d).ptr_;
            if (p_Var12->filter_is_multipart_filter == true) {
              pbVar3 = p_Var12->filter;
              (*pbVar3->_vptr_basic_content_filter[6])(pbVar3,pfVar9);
            }
            break;
          case continue_input:
            break;
          case eof:
            if (local_f0 != buffer_end) {
              return 400;
            }
            p_Var12 = (this->d).ptr_;
            if (p_Var12->read_size != p_Var12->content_length) {
              return 400;
            }
            break;
          case no_room_left:
            return 0x19d;
          default:
            return 400;
          }
        } while (local_f0 != buffer_end);
        bVar6 = pVar7 == eof;
      }
      p_Var12 = (this->d).ptr_;
      lVar10 = p_Var12->content_length;
      lVar13 = p_Var12->read_size;
      if ((bool)(~bVar6 & lVar13 == lVar10)) {
        return 400;
      }
    }
    if (lVar13 == lVar10) {
      if (p_Var12->read_full == true) {
        this_00 = (request *)lazy_content_type(this);
        bVar6 = http::content_type::is_form_urlencoded((content_type *)this_00);
        if (bVar6) {
          p_Var12 = (this->d).ptr_;
          parse_form_urlencoded
                    (this_00,(p_Var12->post_data).super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                     (p_Var12->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&this->post_);
        }
      }
      else {
        pcVar2 = (p_Var12->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (p_Var12->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (p_Var12->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (p_Var12->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pcVar2 != (pointer)0x0) {
          operator_delete(pcVar2);
        }
      }
      p_Var12 = (this->d).ptr_;
      if (p_Var12->filter != (basic_content_filter *)0x0) {
        (*p_Var12->filter->_vptr_basic_content_filter[2])();
        p_Var12 = (this->d).ptr_;
      }
      pmVar4 = (p_Var12->multipart_parser).ptr_;
      if (pmVar4 != (multipart_parser *)0x0) {
        local_58.
        super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pmVar4->files_).
             super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_58.
        super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pmVar4->files_).
             super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_58.
        super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pmVar4->files_).
             super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pmVar4->files_).
        super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pmVar4->files_).
        super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pmVar4->files_).
        super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        booster::hold_ptr<cppcms::impl::multipart_parser>::reset
                  (&((this->d).ptr_)->multipart_parser,(multipart_parser *)0x0);
        if (local_58.
            super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_58.
            super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_38 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->post_;
          paVar1 = &local_98.first.field_2;
          psVar14 = local_58.
                    super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_001c8e35:
          local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (psVar14->super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (psVar14->super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          bVar6 = file::has_mime(local_c8.
                                 super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
          if (!bVar6) {
            file::name_abi_cxx11_
                      (&local_b8,
                       local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            file::size(local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            piVar11 = file::data(local_c8.
                                 super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
            local_e8 = &local_d8;
            local_e0 = 0;
            local_d8._M_local_buf[0] = '\0';
            std::__cxx11::string::reserve((ulong)&local_e8);
            std::istream::seekg(piVar11,0,0);
            plVar5 = *(long **)(piVar11 + *(long *)(*(long *)piVar11 + -0x18) + 0xe8);
            do {
              if ((ulong)plVar5[2] < (ulong)plVar5[3]) {
                plVar5[2] = plVar5[2] + 1;
              }
              else {
                iVar8 = (**(code **)(*plVar5 + 0x50))(plVar5);
                if (iVar8 == -1) goto code_r0x001c8f25;
              }
              std::__cxx11::string::push_back((char)&local_e8);
            } while( true );
          }
          std::
          vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
          ::push_back(&this->files_,&local_c8);
          goto LAB_001c9030;
        }
LAB_001c9051:
        std::
        vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
        ::~vector(&local_58);
        p_Var12 = (this->d).ptr_;
      }
      p_Var12->ready = true;
    }
  }
  return 0;
code_r0x001c8f25:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
    local_98.first.field_2._8_8_ = local_b8.field_2._8_8_;
    local_98.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.first._M_dataplus._M_p = local_b8._M_dataplus._M_p;
  }
  local_98.first.field_2._M_allocated_capacity._1_7_ = local_b8.field_2._M_allocated_capacity._1_7_;
  local_98.first.field_2._M_local_buf[0] = local_b8.field_2._M_local_buf[0];
  local_98.first._M_string_length = local_b8._M_string_length;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_98.second._M_dataplus._M_p = (pointer)&local_98.second.field_2;
  if (local_e8 == &local_d8) {
    local_98.second.field_2._8_8_ = local_d8._8_8_;
  }
  else {
    local_98.second._M_dataplus._M_p = (pointer)local_e8;
  }
  local_98.second.field_2._M_allocated_capacity._1_7_ = local_d8._M_allocated_capacity._1_7_;
  local_98.second.field_2._M_local_buf[0] = local_d8._M_local_buf[0];
  local_98.second._M_string_length = local_e0;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_e8 = &local_d8;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_38,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.second._M_dataplus._M_p != &local_98.second.field_2) {
    operator_delete(local_98.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.first._M_dataplus._M_p);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
LAB_001c9030:
  if (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  psVar14 = psVar14 + 1;
  if (psVar14 ==
      local_58.
      super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001c9051;
  goto LAB_001c8e35;
}

Assistant:

int request::on_content_progress(size_t n)
{
	if(n==0)
		return 0;
	char const *begin = &d->post_data[0];
	char const *end = begin + n;
	d->read_size += n;
	try {
		if(d->filter_is_raw_content_filter) {
			static_cast<raw_content_filter *>(d->filter)->on_data_chunk(&d->post_data[0],n);
		}

		if(d->multipart_parser.get()) {
			multipart_parser::parsing_result_type r = multipart_parser::continue_input;

			long long allowed=d->limits.content_length_limit();

			while(begin!=end) {
				r = d->multipart_parser->consume(begin,end);
				
				switch(r) { 
				case multipart_parser::meta_ready: 	
					{
						if(d->filter_is_multipart_filter) { 
							file &f=d->multipart_parser->get_file();
							static_cast<multipart_filter *>(d->filter)->on_new_file(f); 
						}
					}
					break;
				case multipart_parser::content_partial:
					{
						file &f=d->multipart_parser->get_file();
						if(!size_ok(f,allowed))
							return 413;
						if(d->filter_is_multipart_filter)
							 static_cast<multipart_filter *>(d->filter)->on_upload_progress(f);
					}
					break;
				case multipart_parser::content_ready:	
					{
						file &f=d->multipart_parser->last_file();
						f.data().seekg(0);
						if(!size_ok(f,allowed))
							return 413;
						if(d->filter_is_multipart_filter)
							 static_cast<multipart_filter *>(d->filter)->on_data_ready(f);
					}
					break;
				case multipart_parser::continue_input:
					break;
				case multipart_parser::no_room_left:
					return 413;
				case multipart_parser::eof:
					if(begin!=end) 
						return 400;
					if(d->read_size != d->content_length) 
						return 400;
					break;
				case multipart_parser::parsing_error:
				default:
					return 400;
				}
			}
			if(begin==end && d->read_size==d->content_length && r!=multipart_parser::eof) {
				return 400;
			}
		}

		if(d->read_size == d->content_length) {
			if(d->read_full) {
				if(lazy_content_type().is_form_urlencoded()) {
					char const *data = &d->post_data[0];
					char const *data_end = data + d->post_data.size();
					parse_form_urlencoded(data,data_end,post_);
				}
			}
			else {
				std::vector<char> tmp;
				tmp.swap(d->post_data);
			}
			if(d->filter)
				d->filter->on_end_of_content();
			if(d->multipart_parser.get()) {
				multipart_parser::files_type mp=d->multipart_parser->get_files();
				d->multipart_parser.reset();
				
				for(multipart_parser::files_type::iterator p=mp.begin();p!=mp.end();++p) {
					multipart_parser::file_ptr f=*p;
					if(!f->has_mime()) 
						post_.insert(std::make_pair(f->name(),read_file(f->size(),f->data())));
					else 
						files_.push_back(f);
				}
			}
			d->ready = true;
		}
	}
	catch(abort_upload const &ab) {
		d->no_on_error=true;
		return ab.code();
	}
	catch(std::exception const &e) {
		BOOSTER_ERROR("cppcms") << e.what() << booster::trace(e);
		d->no_on_error=true;
		return 500;
	}
	catch(...) {
		BOOSTER_ERROR("cppcms") << "Unknown exception ";
		d->no_on_error=true;
		return 500;
	}
	return 0;
}